

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_any.hpp
# Opt level: O0

any * __thiscall iutest::any::operator=(any *this,any *rhs)

{
  any local_20;
  any *local_18;
  any *rhs_local;
  any *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  any(&local_20,rhs);
  swap(&local_20,this);
  ~any(&local_20);
  return this;
}

Assistant:

any& operator = (const any& rhs) { any(rhs).swap(*this); return *this; }